

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

err_t CheckCompression(matroska_block *Block,int ForProfile)

{
  ebml_context *peVar1;
  ebml_master *peVar2;
  ebml_integer *Element;
  int64_t iVar3;
  ebml_element *peVar4;
  bool bVar5;
  int local_70;
  int *local_48;
  uint32_t *i;
  bool_t CanDecompress;
  MatroskaTrackEncodingCompAlgo CompressionAlgo;
  ebml_master *Header;
  ebml_master *Elt;
  int ForProfile_local;
  matroska_block *Block_local;
  
  if (Block->ReadTrack == (ebml_master *)0x0) {
    __assert_fail("Block->ReadTrack!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0xe7,"err_t CheckCompression(matroska_block *, int)");
  }
  peVar2 = Block->ReadTrack;
  peVar1 = MATROSKA_getContextContentEncodings();
  peVar2 = (ebml_master *)EBML_MasterFindFirstElt(peVar2,peVar1,0,0,0);
  if (peVar2 != (ebml_master *)0x0) {
    if (Block == (matroska_block *)0xffffffffffffff58) {
      __assert_fail("&(Block->Data)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0xeb,"err_t CheckCompression(matroska_block *, int)");
    }
    if ((Block->Data)._Used != 0) {
      return -4;
    }
    peVar1 = MATROSKA_getContextContentEncoding();
    peVar2 = (ebml_master *)EBML_MasterFindFirstElt(peVar2,peVar1,0,0,0);
    if ((peVar2->Base).Base.Children != (nodetree *)0x0) {
      if (peVar2 == (ebml_master *)(peVar2->Base).Base.Next) {
        __assert_fail("(nodetree*)(Elt) != ((nodetree*)(Elt))->Next",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0xf1,"err_t CheckCompression(matroska_block *, int)");
      }
      if ((peVar2->Base).Base.Next != (nodetree *)0x0) {
        return -3;
      }
      peVar1 = MATROSKA_getContextContentCompression();
      peVar2 = (ebml_master *)EBML_MasterFindFirstElt(peVar2,peVar1,0,0,0);
      if (peVar2 == (ebml_master *)0x0) {
        return -3;
      }
      peVar1 = MATROSKA_getContextContentCompAlgo();
      Element = (ebml_integer *)EBML_MasterFindFirstElt(peVar2,peVar1,1,1,ForProfile);
      if (Element == (ebml_integer *)0x0) {
        local_70 = -1;
      }
      else {
        iVar3 = EBML_IntegerValue(Element);
        local_70 = (int)iVar3;
      }
      if (local_70 == 3) {
        bVar5 = true;
      }
      else if (local_70 == 0) {
        bVar5 = true;
      }
      else if (local_70 == 2) {
        bVar5 = true;
      }
      else {
        bVar5 = local_70 == 1;
      }
      if (!bVar5) {
        return -3;
      }
      iVar3 = EBML_IntegerValue(Element);
      if (iVar3 == 3) {
        peVar1 = MATROSKA_getContextContentCompSettings();
        peVar4 = EBML_MasterFindFirstElt(peVar2,peVar1,0,0,0);
        if (peVar4 != (ebml_element *)0x0) {
          if (Block == (matroska_block *)0xffffffffffffff78) {
            __assert_fail("&(Block->SizeList)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x112,"err_t CheckCompression(matroska_block *, int)");
          }
          local_48 = (int *)(Block->SizeList)._Begin;
          while( true ) {
            if (Block == (matroska_block *)0xffffffffffffff78) {
              __assert_fail("&(Block->SizeList)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                            ,0x112,"err_t CheckCompression(matroska_block *, int)");
            }
            if (local_48 ==
                (int *)((Block->SizeList)._Begin + ((Block->SizeList)._Used & 0xfffffffffffffffc)))
            break;
            *local_48 = (int)peVar4->DataSize + *local_48;
            local_48 = local_48 + 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static err_t CheckCompression(matroska_block *Block, int ForProfile)
{
    ebml_master *Elt, *Header;
    assert(Block->ReadTrack!=NULL);
    Elt = (ebml_master*)EBML_MasterFindChild(Block->ReadTrack, MATROSKA_getContextContentEncodings());
    if (Elt)
    {
        if (ARRAYCOUNT(Block->Data,uint8_t))
            return ERR_INVALID_PARAM; // we cannot adjust sizes if the data are already read

        Elt = (ebml_master*)EBML_MasterFindChild(Elt, MATROSKA_getContextContentEncoding());
        if (EBML_MasterChildren(Elt))
        {
            if (EBML_MasterNext(Elt))
                return ERR_INVALID_DATA; // TODO support cascaded compression/encryption

            Elt = (ebml_master*)EBML_MasterFindChild(Elt, MATROSKA_getContextContentCompression());
            if (!Elt)
                return ERR_INVALID_DATA; // TODO: support encryption

            Header = (ebml_master*)EBML_MasterGetChild(Elt, MATROSKA_getContextContentCompAlgo(), ForProfile);
            MatroskaTrackEncodingCompAlgo CompressionAlgo = Header ? EBML_IntegerValue((ebml_integer*)Header) : MATROSKA_TRACK_ENCODING_COMP_NONE;
            bool_t CanDecompress = 0;
            if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
                CanDecompress = 1;
#if defined(CONFIG_ZLIB)
            else if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_ZLIB)
                CanDecompress = 1;
#endif
#if defined(CONFIG_LZO1X)
            else if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_LZO1X)
                CanDecompress = 1;
#endif
#if defined(CONFIG_BZLIB)
            else if (CompressionAlgo == MATROSKA_TRACK_ENCODING_COMP_BZLIB)
                CanDecompress = 1;
#endif
            if (!CanDecompress)
                return ERR_INVALID_DATA;

            if (EBML_IntegerValue((ebml_integer*)Header)==MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP)
            {
                Header = (ebml_master*)EBML_MasterFindChild(Elt, MATROSKA_getContextContentCompSettings());
                if (Header)
                {
                    uint32_t *i;
                    for (i=ARRAYBEGIN(Block->SizeList,uint32_t);i!=ARRAYEND(Block->SizeList,uint32_t);++i)
                        *i += (uint32_t)Header->Base.DataSize;
                }
            }
        }
    }
    return ERR_NONE;
}